

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O2

xmlXPathObjectPtr xmlXPathEval(xmlChar *str,xmlXPathContextPtr ctx)

{
  xmlGenericErrorFunc p_Var1;
  xmlXPathParserContextPtr ctxt;
  xmlXPathObjectPtr pxVar2;
  xmlGenericErrorFunc *pp_Var3;
  void **ppvVar4;
  
  if (ctx == (xmlXPathContextPtr)0x0) {
    pxVar2 = (xmlXPathObjectPtr)0x0;
    __xmlRaiseError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,(void *)0x0,
                    (void *)0x0,0xc,1,XML_ERR_FATAL,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JFLarvoire[P]libxml2/xpath.c"
                    ,0x3885,(char *)0x0,(char *)0x0,(char *)0x0,0,0,"NULL context pointer\n");
  }
  else {
    xmlInitParser();
    ctxt = xmlXPathNewParserContext(str,ctx);
    if (ctxt == (xmlXPathParserContextPtr)0x0) {
      pxVar2 = (xmlXPathObjectPtr)0x0;
    }
    else {
      xmlXPathEvalExpr(ctxt);
      if (ctxt->error == 0) {
        pxVar2 = valuePop(ctxt);
        if (pxVar2 == (xmlXPathObjectPtr)0x0) {
          pp_Var3 = __xmlGenericError();
          p_Var1 = *pp_Var3;
          ppvVar4 = __xmlGenericErrorContext();
          pxVar2 = (xmlXPathObjectPtr)0x0;
          (*p_Var1)(*ppvVar4,"xmlXPathCompiledEval: No result on the stack.\n");
        }
        else if (0 < ctxt->valueNr) {
          pp_Var3 = __xmlGenericError();
          p_Var1 = *pp_Var3;
          ppvVar4 = __xmlGenericErrorContext();
          (*p_Var1)(*ppvVar4,"xmlXPathCompiledEval: %d object(s) left on the stack.\n",
                    (ulong)(uint)ctxt->valueNr);
        }
      }
      else {
        pxVar2 = (xmlXPathObjectPtr)0x0;
      }
      xmlXPathFreeParserContext(ctxt);
    }
  }
  return pxVar2;
}

Assistant:

xmlXPathObjectPtr
xmlXPathEval(const xmlChar *str, xmlXPathContextPtr ctx) {
    xmlXPathParserContextPtr ctxt;
    xmlXPathObjectPtr res;

    CHECK_CTXT(ctx)

    xmlInitParser();

    ctxt = xmlXPathNewParserContext(str, ctx);
    if (ctxt == NULL)
        return NULL;
    xmlXPathEvalExpr(ctxt);

    if (ctxt->error != XPATH_EXPRESSION_OK) {
	res = NULL;
    } else {
	res = valuePop(ctxt);
        if (res == NULL) {
            xmlGenericError(xmlGenericErrorContext,
                "xmlXPathCompiledEval: No result on the stack.\n");
        } else if (ctxt->valueNr > 0) {
            xmlGenericError(xmlGenericErrorContext,
                "xmlXPathCompiledEval: %d object(s) left on the stack.\n",
                ctxt->valueNr);
        }
    }

    xmlXPathFreeParserContext(ctxt);
    return(res);
}